

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void check_pragma(c2m_ctx_t c2m_ctx,token_t t,VARR_token_t *tokens)

{
  undefined8 uVar1;
  int iVar2;
  token_t *pptVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  
  pptVar3 = VARR_token_taddr(tokens);
  sVar4 = VARR_token_tlength(tokens);
  if (sVar4 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = (ulong)(*(short *)*pptVar3 == 0x20);
  }
  if ((sVar4 <= uVar10) || (*(short *)pptVar3[uVar10] != 0x103)) {
LAB_0016226d:
    uVar1._0_4_ = (t->pos).lno;
    uVar1._4_4_ = (t->pos).ln_pos;
    warning(c2m_ctx,0x18e5cc,(t->pos).fname,uVar1);
    return;
  }
  iVar2 = strcmp(pptVar3[uVar10]->repr,"STDC");
  if (iVar2 != 0) goto LAB_0016226d;
  uVar11 = uVar10 + 1;
  if ((uVar11 < sVar4) && (*(short *)pptVar3[uVar10 + 1] == 0x20)) {
    uVar11 = uVar10 | 2;
  }
  if ((uVar11 < sVar4) && (*(short *)pptVar3[uVar11] == 0x103)) {
    pcVar9 = pptVar3[uVar11]->repr;
    iVar2 = strcmp(pcVar9,"FP_CONTRACT");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar9,"FENV_ACCESS");
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar9,"CX_LIMITED_RANGE");
        if (iVar2 != 0) {
          pcVar6 = (t->pos).fname;
          uVar8._0_4_ = (t->pos).lno;
          uVar8._4_4_ = (t->pos).ln_pos;
          pcVar5 = "unknown STDC pragma %s";
          goto LAB_001623b7;
        }
      }
    }
    uVar10 = uVar11 + 1;
    if ((uVar10 < sVar4) && (*(short *)pptVar3[uVar11 + 1] == 0x20)) {
      uVar10 = uVar11 + 2;
    }
    if ((uVar10 < sVar4) && (*(short *)pptVar3[uVar10] == 0x103)) {
      pcVar9 = pptVar3[uVar10]->repr;
      if (((*pcVar9 != 'O') || (pcVar9[1] != 'N')) || (pcVar9[2] != '\0')) {
        iVar2 = strcmp(pcVar9,"OFF");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar9,"DEFAULT");
          if (iVar2 != 0) {
            pcVar6 = (t->pos).fname;
            uVar8._0_4_ = (t->pos).lno;
            uVar8._4_4_ = (t->pos).ln_pos;
            pcVar5 = "unknown STDC pragma value";
LAB_001623b7:
            error(c2m_ctx,pcVar5,pcVar6,uVar8,pcVar9);
            return;
          }
        }
      }
      uVar11 = uVar10 + 1;
      if ((uVar11 < sVar4) &&
         ((*(short *)pptVar3[uVar10 + 1] == 0x20 || (*(short *)pptVar3[uVar10 + 1] == 10)))) {
        uVar11 = uVar10 + 2;
      }
      if (sVar4 <= uVar11) {
        return;
      }
      pcVar9 = (t->pos).fname;
      uVar7._0_4_ = (t->pos).lno;
      uVar7._4_4_ = (t->pos).ln_pos;
      pcVar6 = "garbage at STDC pragma end";
    }
    else {
      pcVar9 = (t->pos).fname;
      uVar7._0_4_ = (t->pos).lno;
      uVar7._4_4_ = (t->pos).ln_pos;
      pcVar6 = "wrong STDC pragma value";
    }
  }
  else {
    pcVar9 = (t->pos).fname;
    uVar7._0_4_ = (t->pos).lno;
    uVar7._4_4_ = (t->pos).ln_pos;
    pcVar6 = "wrong STDC pragma";
  }
  error(c2m_ctx,pcVar6,pcVar9,uVar7);
  return;
}

Assistant:

static void check_pragma (c2m_ctx_t c2m_ctx, token_t t, VARR (token_t) * tokens) {
  token_t *tokens_arr = VARR_ADDR (token_t, tokens);
  size_t i, tokens_len = VARR_LENGTH (token_t, tokens);

  i = 0;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
#ifdef _WIN32
  if (i + 1 == tokens_len && tokens_arr[i]->code == T_ID
      && strcmp (tokens_arr[i]->repr, "once") == 0) {
    pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
    VARR_PUSH (char_ptr_t, once_include_files, cs->fname);
    return;
  }
#endif
  if (i >= tokens_len || tokens_arr[i]->code != T_ID || strcmp (tokens_arr[i]->repr, "STDC") != 0) {
    warning (c2m_ctx, t->pos, "unknown pragma");
    return;
  }
  i++;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
  if (i >= tokens_len || tokens_arr[i]->code != T_ID) {
    error (c2m_ctx, t->pos, "wrong STDC pragma");
    return;
  }
  if (strcmp (tokens_arr[i]->repr, "FP_CONTRACT") != 0
      && strcmp (tokens_arr[i]->repr, "FENV_ACCESS") != 0
      && strcmp (tokens_arr[i]->repr, "CX_LIMITED_RANGE") != 0) {
    error (c2m_ctx, t->pos, "unknown STDC pragma %s", tokens_arr[i]->repr);
    return;
  }
  i++;
  if (i < tokens_len && tokens_arr[i]->code == ' ') i++;
  if (i >= tokens_len || tokens_arr[i]->code != T_ID) {
    error (c2m_ctx, t->pos, "wrong STDC pragma value");
    return;
  }
  if (strcmp (tokens_arr[i]->repr, "ON") != 0 && strcmp (tokens_arr[i]->repr, "OFF") != 0
      && strcmp (tokens_arr[i]->repr, "DEFAULT") != 0) {
    error (c2m_ctx, t->pos, "unknown STDC pragma value", tokens_arr[i]->repr);
    return;
  }
  i++;
  if (i < tokens_len && (tokens_arr[i]->code == ' ' || tokens_arr[i]->code == '\n')) i++;
  if (i < tokens_len) error (c2m_ctx, t->pos, "garbage at STDC pragma end");
}